

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::
multithreadedCreatePerThreadDeviceTest<vkt::api::(anonymous_namespace)::Event>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  int *piVar1;
  long *plVar2;
  long lVar3;
  undefined8 uVar4;
  TestStatus *__return_storage_ptr___00;
  pointer pSVar5;
  pointer pSVar6;
  deUint32 dVar7;
  int iVar8;
  EnvClone *this;
  long *plVar9;
  void *pvVar10;
  ThreadGroupThread *this_00;
  uint uVar11;
  ulong uVar12;
  allocator_type *__a;
  allocator_type *__a_00;
  size_type __n;
  long lVar13;
  Parameters deviceParams;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>_>_>
  resources;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  perThreadEnv;
  ThreadGroup threads;
  Environment sharedEnv;
  VkEventCreateFlags local_f4;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_f0;
  long local_e0;
  TestStatus *local_d8;
  ulong local_d0;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>_>_>
  local_c8;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  local_b0;
  ThreadGroup local_98;
  Environment local_68;
  
  local_f4 = params.flags;
  local_d8 = __return_storage_ptr__;
  dVar7 = deGetNumAvailableLogicalCores();
  uVar11 = 8;
  if (dVar7 < 8) {
    uVar11 = dVar7;
  }
  __n = 2;
  if (2 < uVar11) {
    __n = (size_type)uVar11;
  }
  iVar8 = tcu::CommandLine::getVKDeviceId(context->m_testCtx->m_cmdLine);
  uVar12 = (ulong)(iVar8 - 1) | 0x300000000;
  local_68.vkp = context->m_platformInterface;
  local_d0 = uVar12;
  local_68.vkd = Context::getDeviceInterface(context);
  local_68.device = Context::getDevice(context);
  local_68.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_68.programBinaries = context->m_progCollection;
  local_68.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_68.maxResourceConsumers = (deUint32)__n;
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  ::vector(&local_b0,__n,__a);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>_>_>
  ::vector(&local_c8,__n,__a_00);
  ThreadGroup::ThreadGroup(&local_98);
  local_e0 = __n << 4;
  lVar13 = 0;
  do {
    this = (EnvClone *)operator_new(0x6c0);
    EnvClone::EnvClone(this,&local_68,(Parameters *)&local_d0,(deUint32)uVar12);
    plVar9 = (long *)operator_new(0x20);
    pSVar6 = local_b0.
             super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)(plVar9 + 1) = 0;
    *(undefined4 *)((long)plVar9 + 0xc) = 0;
    *plVar9 = (long)&PTR__SharedPtrState_00d525c8;
    plVar9[2] = (long)this;
    *(undefined4 *)(plVar9 + 1) = 1;
    *(undefined4 *)((long)plVar9 + 0xc) = 1;
    plVar2 = *(long **)((long)&(local_b0.
                                super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_state + lVar13);
    if (plVar2 != plVar9) {
      if (plVar2 != (long *)0x0) {
        LOCK();
        plVar2 = plVar2 + 1;
        *(int *)plVar2 = (int)*plVar2 + -1;
        UNLOCK();
        if ((int)*plVar2 == 0) {
          *(undefined8 *)
           ((long)&(local_b0.
                    super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar13) = 0;
          (**(code **)(**(long **)((long)&(local_b0.
                                           super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_state +
                                  lVar13) + 0x10))();
        }
        LOCK();
        piVar1 = (int *)(*(long *)((long)&pSVar6->m_state + lVar13) + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          plVar2 = *(long **)((long)&pSVar6->m_state + lVar13);
          if (plVar2 != (long *)0x0) {
            (**(code **)(*plVar2 + 8))();
          }
          *(undefined8 *)((long)&pSVar6->m_state + lVar13) = 0;
        }
      }
      *(EnvClone **)((long)&pSVar6->m_ptr + lVar13) = this;
      *(long **)((long)&pSVar6->m_state + lVar13) = plVar9;
      LOCK();
      *(int *)(plVar9 + 1) = (int)plVar9[1] + 1;
      UNLOCK();
      LOCK();
      piVar1 = (int *)(*(long *)((long)&pSVar6->m_state + lVar13) + 0xc);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    LOCK();
    plVar2 = plVar9 + 1;
    *(int *)plVar2 = (int)*plVar2 + -1;
    UNLOCK();
    if ((int)*plVar2 == 0) {
      (**(code **)(*plVar9 + 0x10))(plVar9);
    }
    LOCK();
    piVar1 = (int *)((long)plVar9 + 0xc);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      (**(code **)(*plVar9 + 8))(plVar9);
    }
    pvVar10 = operator_new(1);
    plVar9 = (long *)operator_new(0x20);
    pSVar5 = local_c8.
             super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)(plVar9 + 1) = 0;
    *(undefined4 *)((long)plVar9 + 0xc) = 0;
    *plVar9 = (long)&PTR__SharedPtrState_00d529d0;
    plVar9[2] = (long)pvVar10;
    *(undefined4 *)(plVar9 + 1) = 1;
    *(undefined4 *)((long)plVar9 + 0xc) = 1;
    plVar2 = *(long **)((long)&(local_c8.
                                super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_state + lVar13);
    if (plVar2 != plVar9) {
      if (plVar2 != (long *)0x0) {
        LOCK();
        plVar2 = plVar2 + 1;
        *(int *)plVar2 = (int)*plVar2 + -1;
        UNLOCK();
        if ((int)*plVar2 == 0) {
          *(undefined8 *)
           ((long)&(local_c8.
                    super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar13) = 0;
          (**(code **)(**(long **)((long)&(local_c8.
                                           super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_state +
                                  lVar13) + 0x10))();
        }
        LOCK();
        piVar1 = (int *)(*(long *)((long)&pSVar5->m_state + lVar13) + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          plVar2 = *(long **)((long)&pSVar5->m_state + lVar13);
          if (plVar2 != (long *)0x0) {
            (**(code **)(*plVar2 + 8))();
          }
          *(undefined8 *)((long)&pSVar5->m_state + lVar13) = 0;
        }
      }
      *(void **)((long)&pSVar5->m_ptr + lVar13) = pvVar10;
      *(long **)((long)&pSVar5->m_state + lVar13) = plVar9;
      LOCK();
      *(int *)(plVar9 + 1) = (int)plVar9[1] + 1;
      UNLOCK();
      LOCK();
      piVar1 = (int *)(*(long *)((long)&pSVar5->m_state + lVar13) + 0xc);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    LOCK();
    plVar2 = plVar9 + 1;
    *(int *)plVar2 = (int)*plVar2 + -1;
    UNLOCK();
    if ((int)*plVar2 == 0) {
      (**(code **)(*plVar9 + 0x10))(plVar9);
    }
    LOCK();
    piVar1 = (int *)((long)plVar9 + 0xc);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      (**(code **)(*plVar9 + 8))(plVar9);
    }
    this_00 = (ThreadGroupThread *)operator_new(0x88);
    lVar3 = *(long *)((long)&(local_b0.
                              super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar13);
    uVar4 = *(undefined8 *)
             ((long)&(local_c8.
                      super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar13);
    ThreadGroupThread::ThreadGroupThread(this_00);
    (this_00->super_Thread)._vptr_Thread = (_func_int **)&PTR__ThreadGroupThread_00d52a10;
    this_00[1].super_Thread._vptr_Thread = (_func_int **)(lVar3 + 0x688);
    *(undefined8 *)&this_00[1].super_Thread.m_attribs = uVar4;
    this_00[1].super_Thread.m_thread = (deThread)&local_f4;
    local_f0.
    super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    .m_data.ptr = this_00;
    ThreadGroup::add(&local_98,&local_f0);
    __return_storage_ptr___00 = local_d8;
    if (local_f0.
        super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
        .m_data.ptr != (ThreadGroupThread *)0x0) {
      (*((local_f0.
          super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
          .m_data.ptr)->super_Thread)._vptr_Thread[1])();
      local_f0.
      super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
      .m_data.ptr = (ThreadGroupThread *)0x0;
    }
    lVar13 = lVar13 + 0x10;
  } while (local_e0 != lVar13);
  ThreadGroup::run(__return_storage_ptr___00,&local_98);
  de::SpinBarrier::~SpinBarrier(&local_98.m_barrier);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
  ::~vector(&local_98.m_threads);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>_>_>
  ::~vector(&local_c8);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  ::~vector(&local_b0);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus multithreadedCreatePerThreadDeviceTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<EnvClone>						EnvPtr;
	typedef SharedPtr<typename Object::Resources>	ResPtr;

	const deUint32				numThreads		= getDefaultTestThreadCount();
	const Device::Parameters	deviceParams	= getDefaulDeviceParameters(context);
	const Environment			sharedEnv		(context, numThreads);			// For creating Device's
	vector<EnvPtr>				perThreadEnv	(numThreads);
	vector<ResPtr>				resources		(numThreads);
	ThreadGroup					threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
	{
		perThreadEnv[ndx]	= EnvPtr(new EnvClone(sharedEnv, deviceParams, 1u));
		resources[ndx]		= ResPtr(new typename Object::Resources(perThreadEnv[ndx]->env, params));

		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(perThreadEnv[ndx]->env, *resources[ndx], params)));
	}

	return threads.run();
}